

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O1

void __thiscall sophia_interface::LUEXEC(sophia_interface *this)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  double (*padVar8) [4000];
  long lVar9;
  sophia_interface *psVar10;
  double (*padVar11) [4000];
  long lVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  sophia_interface *local_148 [2];
  undefined1 local_138 [16];
  undefined1 local_128 [32];
  undefined1 local_108 [40];
  int aiStack_e0 [4];
  sophia_interface *local_d0 [2];
  undefined1 local_c0 [24];
  double dStack_a8;
  double PS [6] [2];
  
  PS[4][1] = 0.0;
  PS[5][0] = 0.0;
  PS[3][1] = 0.0;
  PS[4][0] = 0.0;
  PS[2][1] = 0.0;
  PS[3][0] = 0.0;
  PS[1][1] = 0.0;
  PS[2][0] = 0.0;
  PS[0][1] = 0.0;
  PS[1][0] = 0.0;
  dStack_a8 = 0.0;
  PS[0][0] = 0.0;
  MSTU[0x17] = 0;
  psVar10 = this;
  if (0 < MSTU[0xb]) {
    psVar10 = (sophia_interface *)local_148;
    local_148[0] = (sophia_interface *)local_138;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_148,"LULIST(0), Method removed.","");
    LUERRM(psVar10,-1,(string *)local_148);
    psVar10 = local_148[0];
    if (local_148[0] != (sophia_interface *)local_138) {
      operator_delete(local_148[0]);
    }
  }
  MSTU[0x1e] = MSTU[0x1e] + 1;
  MSTU[0] = 0;
  MSTU[1] = 0;
  MSTU[2] = 0;
  if (MSTU[0x10] < 1) {
    MSTU[0x59] = 0;
  }
  PS[5][1]._4_4_ = this->N;
  if (0 < PS[5][1]._4_4_) {
    padVar11 = this->P;
    lVar12 = 0;
    do {
      if (0xfffffff5 < this->K[0][lVar12] - 0xbU) {
        lVar9 = 0;
        padVar8 = padVar11;
        do {
          *(double *)((long)PS[-1] + lVar9 + 8) =
               (*padVar8)[0] + *(double *)((long)PS[-1] + lVar9 + 8);
          lVar9 = lVar9 + 0x10;
          padVar8 = padVar8 + 1;
        } while (lVar9 != 0x40);
        iVar4 = LUCHGE(psVar10,this->K[1][lVar12]);
        PS[4][1] = (double)iVar4 + PS[4][1];
      }
      lVar12 = lVar12 + 1;
      padVar11 = (double (*) [4000])(*padVar11 + 1);
    } while (lVar12 < this->N);
  }
  local_108._32_8_ = PS[2][1];
  aiStack_e0[0] = 0;
  aiStack_e0[1] = 0;
  PARU[0x14] = PS[2][1];
  psVar10 = this;
  LUPREP(this,0);
  local_c0._16_8_ = 0;
  bVar3 = true;
  do {
    uVar5 = (int)local_c0._16_8_ + 1;
    lVar12 = 0;
    do {
      iVar4 = this->K[0][lVar12];
      iVar6 = 0;
      if (iVar4 - 1U < 10) {
        iVar6 = LUCOMP(psVar10,this->K[1][lVar12]);
      }
      lVar9 = lVar12 + 1;
      if (iVar6 != 0) {
        iVar2 = (int)lVar12;
        if (KCHG[0][(long)iVar6 + 499] == 0) {
          if ((0 < MSTJ[0x14]) && (0 < MDCY[-1][(long)iVar6 + 499])) {
            if ((0 < MSTJ[0x32] && uVar5 != 2) && (PMAS[0][(long)iVar6 + 499] < PARJ[0x5a])) {
              iVar4 = this->K[1][lVar12];
              iVar6 = -iVar4;
              if (0 < iVar4) {
                iVar6 = iVar4;
              }
              if (iVar6 != 0x137) goto LAB_0010d549;
            }
            psVar10 = this;
            LUDECY(this,iVar2 + 1);
          }
LAB_0010d549:
          iVar4 = MSTJ[0x5b];
          lVar13 = (long)MSTJ[0x5b];
          if (lVar13 < 1) {
            if (-1 < MSTJ[0x5b]) goto LAB_0010d6be;
            iVar4 = -MSTJ[0x5b];
            dVar1 = this->P[4][lVar12];
            iVar6 = -3;
          }
          else {
            uVar7 = MSTJ[0x5b] - 1;
            dVar1 = this->P[3][uVar7] + this->P[3][lVar13];
            dVar14 = this->P[0][uVar7] + this->P[0][lVar13];
            dVar15 = this->P[1][uVar7] + this->P[1][lVar13];
            dVar16 = this->P[2][uVar7] + this->P[2][lVar13];
            dVar1 = ((dVar1 * dVar1 - dVar14 * dVar14) - dVar15 * dVar15) - dVar16 * dVar16;
            if (dVar1 <= 0.0) {
              dVar1 = 0.0;
            }
            if (dVar1 < 0.0) {
              dVar1 = sqrt(dVar1);
            }
            else {
              dVar1 = SQRT(dVar1);
            }
            iVar6 = iVar4 + 1;
          }
          LUSHOW(this,iVar4,iVar6,dVar1);
          psVar10 = this;
          LUPREP(this,iVar4);
          MSTJ[0x5b] = 0;
        }
        else if (iVar4 - 1U < 2) {
          iVar6 = MSTJ[0];
          if (0 < MSTJ[0]) {
            iVar6 = 2;
          }
          if (iVar4 != 1) {
            iVar6 = MSTJ[0];
          }
          if ((((((1 < MSTJ[0x14]) && (iVar4 == 2)) && (lVar9 < this->N)) &&
               ((this->K[0][lVar12 + 1] == 1 && (iVar4 = this->K[2][lVar12], iVar4 <= lVar12)))) &&
              ((this->K[2][lVar12 + 1] == iVar4 &&
               ((0 < iVar4 &&
                (iVar4 = LUCOMP(psVar10,this->K[1][iVar4 - 1]), KCHG[0][(long)iVar4 + 499] == 0)))))
              ) && (0 < iVar6)) {
            iVar6 = 1;
          }
          if (iVar6 == 1) {
            psVar10 = this;
            LUSTRF(this,iVar2 + 1);
          }
          if ((iVar6 == 2) && (psVar10 = this, LUINDF(this,iVar2 + 1), this->K[0][lVar12] == 1)) {
            bVar3 = false;
          }
          if (iVar6 == 2) {
            if ((uint)(MSTJ[2] * -0x33333333) < 0x33333334) {
              bVar3 = false;
            }
            if (MSTJ[2] < 1) {
              bVar3 = false;
            }
          }
        }
      }
LAB_0010d6be:
      if ((MSTU[0x17] != 0) && (1 < MSTU[0x14])) goto LAB_0010d744;
      iVar4 = this->N;
      if (iVar4 <= lVar9) goto LAB_0010d744;
      lVar12 = lVar9;
    } while (iVar4 < (MSTU[3] - MSTU[0x1f]) + -0x14);
    if (lVar9 < iVar4) {
      psVar10 = (sophia_interface *)local_d0;
      local_d0[0] = (sophia_interface *)local_c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d0,"LUEXEC: no more memory left in LUJETS","");
      LUERRM(psVar10,0xb,(string *)local_d0);
      psVar10 = local_d0[0];
      if (local_d0[0] != (sophia_interface *)local_c0) {
        operator_delete(local_d0[0]);
      }
    }
LAB_0010d744:
    if ((local_c0._16_4_ != 0) || (MSTJ[0x32] < 1)) {
      if (0 < this->N) {
        padVar11 = this->P;
        lVar12 = 0;
        do {
          if (0xfffffff5 < this->K[0][lVar12] - 0xbU) {
            lVar9 = 0;
            padVar8 = padVar11;
            do {
              *(double *)((long)PS[0] + lVar9) = (*padVar8)[0] + *(double *)((long)PS[0] + lVar9);
              padVar8 = padVar8 + 1;
              lVar9 = lVar9 + 0x10;
            } while (lVar9 != 0x40);
            iVar4 = LUCHGE(psVar10,this->K[1][lVar12]);
            PS[5][0] = (double)iVar4 + PS[5][0];
          }
          lVar12 = lVar12 + 1;
          padVar11 = (double (*) [4000])(*padVar11 + 1);
        } while (lVar12 < this->N);
      }
      if (bVar3) {
        if (PARU[10] <
            (ABS(PS[0][0] - dStack_a8) + ABS(PS[1][0] - PS[0][1]) + ABS(PS[2][0] - PS[1][1]) +
            ABS(PS[3][0] - (double)local_108._32_8_)) /
            (ABS(PS[3][0]) + 1.0 + ABS((double)local_108._32_8_))) {
          psVar10 = (sophia_interface *)local_128;
          local_128._0_8_ = local_128 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_128,"LUEXEC: four-momentum was not conserved","");
          LUERRM(psVar10,0xf,(string *)local_128);
          if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
            operator_delete((void *)local_128._0_8_);
          }
        }
        if (0.1 < ABS(PS[5][0] - PS[4][1])) {
          psVar10 = (sophia_interface *)local_108;
          local_108._0_8_ = local_108 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_108,"LUEXEC: charge was not conserved","");
          LUERRM(psVar10,0xf,(string *)local_108);
          if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
            operator_delete((void *)local_108._0_8_);
          }
        }
      }
      return;
    }
    psVar10 = this;
    LUBOEI(this,PS[5][1]._4_4_);
    local_c0._16_8_ = ZEXT48(uVar5);
  } while( true );
}

Assistant:

void sophia_interface::LUEXEC() {
// Purpose: to administrate the fragmentation and decay chain.
    double PS[6][2] = {0.};

    // Initialize and reset.
    MSTU[23] = 0;
    if (MSTU[11] >= 1) LUERRM(-1, "LULIST(0), Method removed.");
    MSTU[30]++;
    MSTU[0] = 0;
    MSTU[1] = 0;
    MSTU[2] = 0;
    if (MSTU[16] <= 0) MSTU[89] = 0;
    int MCONS = 1;

    // Sum up momentum, energy and charge for starting entries.
    int NSAV = N;
    for (int I = 0; I < N; ++I) {
        if (K[0][I] <= 0 || K[0][I] > 10) continue;
        for (int J = 0; J < 4; ++J) {
            PS[J][0] += P[J][I];
        }
        PS[5][0] += LUCHGE(K[1][I]);
    }
    PARU[20] = PS[3][0];

    // Prepare system for subsequent fragmentation/decay.
    LUPREP(0);

    // Loop through jet fragmentation and particle decays.
    int MBE = 0;
    bool repeat140 = false;
    do {  // 140
        repeat140 = false;
        MBE++;
        int IP = 0;

        bool repeat150 = false;
        do {  // 150
            repeat150 = false;
            IP++;
            int KC = 0;
            if (K[0][IP - 1] > 0 && K[0][IP - 1] <= 10) KC = LUCOMP(K[1][IP - 1]);
            if (KC == 0) {
                // do nothing
            // Particle decay if unstable and allowed. Save long-lived particle
            // decays until second pass after Bose-Einstein effects.
            } else if (KCHG[1][KC - 1] == 0) {
                if (MSTJ[20] >= 1 && MDCY[0][KC - 1] >= 1 && (MSTJ[50] <= 0 || MBE == 2 || PMAS[1][KC - 1] >= PARJ[90] || std::abs(K[1][IP - 1]) == 311)) {
                    LUDECY(IP);
                }

                // Decay products may develop a shower.
                if (MSTJ[91] > 0) {
                    int IP1 = MSTJ[91];
                    double QMAX = std::sqrt(std::max(0., (P[3][IP1 - 1] + P[3][IP1]) * (P[3][IP1 - 1] + P[3][IP1]) - (P[0][IP1 - 1] + P[0][IP1]) * (P[0][IP1 - 1] + P[0][IP1]) - (P[1][IP1 - 1] + P[1][IP1]) * (P[1][IP1 - 1] + P[1][IP1]) - (P[2][IP1 - 1] + P[2][IP1]) * (P[2][IP1 - 1] + P[2][IP1])));
                    LUSHOW(IP1, IP1 + 1, QMAX);
                    LUPREP(IP1);
                    MSTJ[91] = 0;
                } else if (MSTJ[91] < 0) {
                    int IP1 = -MSTJ[91];
                    LUSHOW(IP1, -3, P[4][IP - 1]);
                    LUPREP(IP1);
                    MSTJ[91] = 0;
                }

            // Jet fragmentation: string or independent fragmentation.
            } else if (K[0][IP - 1] == 1 || K[0][IP - 1] == 2) {
                int MFRAG = MSTJ[0];
                if (MFRAG >= 1 && K[0][IP - 1] == 1) MFRAG = 2;
                if (MSTJ[20] >= 2 && K[0][IP - 1] == 2 && N > IP) {
                    if (K[0][IP] == 1 && K[2][IP] == K[2][IP - 1] && K[2][IP - 1] > 0 && K[2][IP - 1] < IP) {
                        if (KCHG[1][LUCOMP(K[1][K[2][IP - 1] - 1]) - 1] == 0) MFRAG = std::min(1, MFRAG);
                    }
                }

                if (MFRAG == 1) LUSTRF(IP);
                if (MFRAG == 2) LUINDF(IP);

                if (MFRAG == 2 && K[0][IP - 1] == 1) MCONS = 0;
                if (MFRAG == 2 && (MSTJ[2] <= 0 || MSTJ[2] % 5 == 0)) MCONS = 0;
            }

            // Loop back if enough space left in LUJETS and no error abort.
            if (MSTU[23] != 0 && MSTU[20] >= 2) {
                // do nothing
            } else if (IP < N && N < MSTU[3] - 20 - MSTU[31]) {
                repeat150 = true;
                continue;
            } else if (IP < N) {
                LUERRM(11, "LUEXEC: no more memory left in LUJETS");
            }
        } while (repeat150);  // 150

        // Include simple Bose-Einstein effect parametrization if desired.
        if (MBE == 1 && MSTJ[50] >= 1) {
            LUBOEI(NSAV);
            repeat140 = true;
            continue;
        }
    } while (repeat140);  // 140

    // Check that momentum, energy and charge were conserved.
    for (int I = 0; I < N; ++I) {
        if (K[0][I] <= 0 || K[0][I] > 10) continue;
        for (int J = 0; J < 4; ++J) {
            PS[J][1] += P[J][I];
        }
        PS[5][1] += LUCHGE(K[1][I]);
    }
    double PDEV = (std::abs(PS[0][1] - PS[0][0]) + std::abs(PS[1][1] - PS[1][0]) + std::abs(PS[2][1] - PS[2][0]) + std::abs(PS[3][1] - PS[3][0])) / (1. + std::abs(PS[3][1]) + std::abs(PS[3][0]));
    if (MCONS == 1 && PDEV > PARU[10]) LUERRM(15, "LUEXEC: four-momentum was not conserved");
    if (MCONS == 1 && std::abs(PS[5][1] - PS[5][0]) > 0.1) LUERRM(15, "LUEXEC: charge was not conserved");
    return;
}